

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-test.c++
# Opt level: O1

void __thiscall kj::anon_unknown_0::TestCase258::run(TestCase258 *this)

{
  PromiseNode *pPVar1;
  long *plVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  __pid_t _Var5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  bool bVar7;
  char buf [4];
  PipeThread pipeThread;
  AsyncIoContext ioContext;
  char local_200 [4];
  uint local_1fc;
  Own<kj::_::PromiseNode> local_1f8;
  undefined8 *local_1e8;
  long local_1e0;
  undefined8 *local_1d8;
  long *local_1d0;
  undefined8 *local_1c8;
  long *local_1c0;
  undefined8 *local_1b8;
  long *local_1b0;
  undefined8 *local_1a8;
  long *local_1a0;
  WaitScope *local_198;
  ExceptionOrValue local_188;
  char local_28;
  
  setupAsyncIo();
  plVar2 = local_1a0;
  local_1c0 = (long *)operator_new(0x10);
  *local_1c0 = (long)&PTR_operator___004560e8;
  local_1c8 = &_::
               HeapDisposer<kj::Function<void(kj::AsyncIoProvider&,kj::AsyncIoStream&,kj::WaitScope&)>::Impl<kj::(anonymous_namespace)::TestCase258::run()::$_0>>
               ::instance;
  (**(code **)(*plVar2 + 0x20))(&local_1e8,plVar2);
  plVar2 = local_1c0;
  if (local_1c0 != (long *)0x0) {
    local_1c0 = (long *)0x0;
    (**(code **)*local_1c8)(local_1c8,(long)plVar2 + *(long *)(*plVar2 + -0x10));
  }
  (**(code **)(*local_1d0 + 8))(&local_188,local_1d0,local_200,3,4);
  _Var5 = Promise<unsigned_long>::wait((Promise<unsigned_long> *)&local_188,local_198);
  uVar4 = local_188.exception.ptr.field_1.value.ownFile.content.ptr;
  if ((PromiseNode *)local_188.exception.ptr.field_1.value.ownFile.content.ptr != (PromiseNode *)0x0
     ) {
    local_188.exception.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
    (***(_func_int ***)local_188.exception.ptr._0_8_)
              (local_188.exception.ptr._0_8_,(char *)(uVar4 + (long)(*(_func_int ***)uVar4)[-2]));
  }
  if ((CONCAT44(extraout_var,_Var5) != 3) && (_::Debug::minSeverity < 3)) {
    local_1fc = 3;
    (**(code **)(*local_1d0 + 8))(&local_188,local_1d0,local_200,3,4);
    _Var5 = Promise<unsigned_long>::wait((Promise<unsigned_long> *)&local_188,local_198);
    local_1f8.disposer = (Disposer *)CONCAT44(extraout_var_00,_Var5);
    _::Debug::log<char_const(&)[89],unsigned_int,unsigned_long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-test.c++"
               ,0x110,ERROR,
               "\"failed: expected \" \"(3u) == (pipeThread.pipe->tryRead(buf, 3, 4).wait(ioContext.waitScope))\", 3u, pipeThread.pipe->tryRead(buf, 3, 4).wait(ioContext.waitScope)"
               ,(char (*) [89])
                "failed: expected (3u) == (pipeThread.pipe->tryRead(buf, 3, 4).wait(ioContext.waitScope))"
               ,&local_1fc,(unsigned_long *)&local_1f8);
    uVar4 = local_188.exception.ptr.field_1.value.ownFile.content.ptr;
    if ((PromiseNode *)local_188.exception.ptr.field_1.value.ownFile.content.ptr !=
        (PromiseNode *)0x0) {
      local_188.exception.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
      (***(_func_int ***)local_188.exception.ptr._0_8_)
                (local_188.exception.ptr._0_8_,(char *)(uVar4 + (long)(*(_func_int ***)uVar4)[-2]));
    }
  }
  heapString((String *)&local_188,local_200,3);
  uVar4 = local_188.exception.ptr.field_1.value.ownFile.content.ptr;
  bVar7 = true;
  if ((PromiseNode *)local_188.exception.ptr.field_1.value.ownFile.content.ptr ==
      (PromiseNode *)&DAT_00000004) {
    iVar6 = bcmp((void *)local_188.exception.ptr._0_8_,"foo",3);
    bVar7 = iVar6 != 0;
  }
  uVar3 = local_188.exception.ptr._0_8_;
  if ((Disposer *)local_188.exception.ptr._0_8_ != (Disposer *)0x0) {
    local_188.exception.ptr._0_8_ = (Disposer *)0x0;
    local_188.exception.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
    (***(_func_int ***)local_188.exception.ptr.field_1.value.ownFile.content.size_)
              (local_188.exception.ptr.field_1.value.ownFile.content.size_,uVar3,1,uVar4,uVar4,0);
  }
  if ((bool)(bVar7 & _::Debug::minSeverity < 3)) {
    heapString((String *)&local_188,local_200,3);
    _::Debug::log<char_const(&)[49],char_const(&)[4],kj::String>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-test.c++"
               ,0x111,ERROR,
               "\"failed: expected \" \"(\\\"foo\\\") == (heapString(buf, 3))\", \"foo\", heapString(buf, 3)"
               ,(char (*) [49])"failed: expected (\"foo\") == (heapString(buf, 3))",
               (char (*) [4])0x3a5188,(String *)&local_188);
    uVar3 = local_188.exception.ptr.field_1.value.ownFile.content.ptr;
    uVar4 = local_188.exception.ptr._0_8_;
    if ((Disposer *)local_188.exception.ptr._0_8_ != (Disposer *)0x0) {
      local_188.exception.ptr._0_8_ = (Disposer *)0x0;
      local_188.exception.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
      (***(_func_int ***)local_188.exception.ptr.field_1.value.ownFile.content.size_)
                (local_188.exception.ptr.field_1.value.ownFile.content.size_,uVar4,1,uVar3,uVar3,0);
    }
  }
  (**(code **)local_1d0[1])(&local_1f8,local_1d0 + 1,"bar",3);
  local_188.exception.ptr._0_8_ = local_188.exception.ptr._0_8_ & 0xffffffffffffff00;
  local_28 = '\0';
  _::waitImpl(&local_1f8,&local_188,local_198);
  if (local_28 == '\x01') {
    if (local_188.exception.ptr.isSet != false) {
      throwRecoverableException(&local_188.exception.ptr.field_1.value,0);
    }
  }
  else {
    if (local_188.exception.ptr.isSet == false) {
      _::unreachable();
    }
    throwRecoverableException(&local_188.exception.ptr.field_1.value,0);
  }
  if (local_188.exception.ptr.isSet == true) {
    Exception::~Exception(&local_188.exception.ptr.field_1.value);
  }
  pPVar1 = local_1f8.ptr;
  if (local_1f8.ptr != (PromiseNode *)0x0) {
    local_1f8.ptr = (PromiseNode *)0x0;
    (**(local_1f8.disposer)->_vptr_Disposer)
              (local_1f8.disposer,
               (_func_int *)((long)&pPVar1->_vptr_PromiseNode + (long)pPVar1->_vptr_PromiseNode[-2])
              );
  }
  (**(code **)(*local_1d0 + 8))(&local_188,local_1d0,local_200,1,1);
  _Var5 = Promise<unsigned_long>::wait((Promise<unsigned_long> *)&local_188,local_198);
  uVar4 = local_188.exception.ptr.field_1.value.ownFile.content.ptr;
  if ((PromiseNode *)local_188.exception.ptr.field_1.value.ownFile.content.ptr != (PromiseNode *)0x0
     ) {
    local_188.exception.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
    (***(_func_int ***)local_188.exception.ptr._0_8_)
              (local_188.exception.ptr._0_8_,(char *)(uVar4 + (long)(*(_func_int ***)uVar4)[-2]));
  }
  if ((CONCAT44(extraout_var_01,_Var5) != 0) && (_::Debug::minSeverity < 3)) {
    local_1fc = 0;
    (**(code **)(*local_1d0 + 8))(&local_188,local_1d0,local_200,1,1);
    _Var5 = Promise<unsigned_long>::wait((Promise<unsigned_long> *)&local_188,local_198);
    local_1f8.disposer = (Disposer *)CONCAT44(extraout_var_02,_Var5);
    _::Debug::log<char_const(&)[88],int,unsigned_long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-test.c++"
               ,0x116,ERROR,
               "\"failed: expected \" \"(0) == (pipeThread.pipe->tryRead(buf, 1, 1).wait(ioContext.waitScope))\", 0, pipeThread.pipe->tryRead(buf, 1, 1).wait(ioContext.waitScope)"
               ,(char (*) [88])
                "failed: expected (0) == (pipeThread.pipe->tryRead(buf, 1, 1).wait(ioContext.waitScope))"
               ,(int *)&local_1fc,(unsigned_long *)&local_1f8);
    uVar4 = local_188.exception.ptr.field_1.value.ownFile.content.ptr;
    if ((PromiseNode *)local_188.exception.ptr.field_1.value.ownFile.content.ptr !=
        (PromiseNode *)0x0) {
      local_188.exception.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
      (***(_func_int ***)local_188.exception.ptr._0_8_)
                (local_188.exception.ptr._0_8_,(char *)(uVar4 + (long)(*(_func_int ***)uVar4)[-2]));
    }
  }
  plVar2 = local_1d0;
  if (local_1d0 != (long *)0x0) {
    local_1d0 = (long *)0x0;
    (**(code **)*local_1d8)(local_1d8,(long)plVar2 + *(long *)(*plVar2 + -0x10));
  }
  if (local_1e0 != 0) {
    local_1e0 = 0;
    (**(code **)*local_1e8)();
  }
  plVar2 = local_1a0;
  if (local_1a0 != (long *)0x0) {
    local_1a0 = (long *)0x0;
    (**(code **)*local_1a8)(local_1a8,(long)plVar2 + *(long *)(*plVar2 + -0x10));
  }
  plVar2 = local_1b0;
  if (local_1b0 != (long *)0x0) {
    local_1b0 = (long *)0x0;
    (**(code **)*local_1b8)(local_1b8,(long)plVar2 + *(long *)(*plVar2 + -0x10));
  }
  return;
}

Assistant:

TEST(AsyncIo, PipeThreadDisconnects) {
  // Like above, but in this case we expect the main thread to detect the pipe thread disconnecting.

  auto ioContext = setupAsyncIo();

  auto pipeThread = ioContext.provider->newPipeThread(
      [](AsyncIoProvider& ioProvider, AsyncIoStream& stream, WaitScope& waitScope) {
    char buf[4];
    stream.write("foo", 3).wait(waitScope);
    EXPECT_EQ(3u, stream.tryRead(buf, 3, 4).wait(waitScope));
    EXPECT_EQ("bar", heapString(buf, 3));
  });

  char buf[4];
  EXPECT_EQ(3u, pipeThread.pipe->tryRead(buf, 3, 4).wait(ioContext.waitScope));
  EXPECT_EQ("foo", heapString(buf, 3));

  pipeThread.pipe->write("bar", 3).wait(ioContext.waitScope);

  // Expect disconnect.
  EXPECT_EQ(0, pipeThread.pipe->tryRead(buf, 1, 1).wait(ioContext.waitScope));
}